

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exampleMainExtended.cpp
# Opt level: O2

int logFileCallBack(int index,char **buff)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"log to ");
  poVar1 = std::operator<<(poVar1,buff[(long)index + 1]);
  std::endl<char,std::char_traits<char>>(poVar1);
  return index + 1;
}

Assistant:

int logFileCallBack(int index, char **buff) {
    index++;
    cout << "log to " << buff[index] << endl;
    return index; // +1 because one further argument has been used
}